

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O0

Value<char> * __thiscall Qentem::Value<char>::operator=(Value<char> *this,uint num)

{
  uint num_local;
  Value<char> *this_local;
  
  reset(this);
  QNumber64::operator=((QNumber64 *)this,num);
  setTypeToUInt64(this);
  return this;
}

Assistant:

Value &operator=(Number_T num) noexcept {
        reset();
        number_ = num;

        if QENTEM_CONST_EXPRESSION (IsFloat<Number_T>()) {
            setTypeToDouble();
        } else if QENTEM_CONST_EXPRESSION (IsUnsigned<Number_T>()) {
            setTypeToUInt64();
        } else {
            setTypeToInt64();
        }